

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

int bsdtar_getopt(bsdtar *bsdtar)

{
  undefined8 *puVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  long in_RDI;
  int required;
  int opt;
  size_t optlength;
  char *long_prefix;
  char *p;
  bsdtar_option *match2;
  bsdtar_option *match;
  bsdtar_option *popt;
  uint local_44;
  size_t local_40;
  char *local_38;
  bsdtar_option *local_28;
  bsdtar_option *local_20;
  bsdtar *in_stack_ffffffffffffffe8;
  bsdtar_option *pbVar5;
  bsdtar_option *pbVar6;
  uint local_4;
  
  local_20 = (bsdtar_option *)0x0;
  local_28 = (bsdtar_option *)0x0;
  local_38 = "--";
  local_44 = 0x3f;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  if (*(int *)(in_RDI + 0x78) == 0) {
    *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 8;
    *(int *)(in_RDI + 0x8c) = *(int *)(in_RDI + 0x8c) + -1;
    if (**(long **)(in_RDI + 0x90) == 0) {
      return -1;
    }
    if (*(char *)**(undefined8 **)(in_RDI + 0x90) == '-') {
      *(undefined4 *)(in_RDI + 0x78) = 2;
    }
    else {
      *(undefined4 *)(in_RDI + 0x78) = 1;
      puVar1 = *(undefined8 **)(in_RDI + 0x90);
      *(undefined8 **)(in_RDI + 0x90) = puVar1 + 1;
      *(undefined8 *)(in_RDI + 0x80) = *puVar1;
      *(int *)(in_RDI + 0x8c) = *(int *)(in_RDI + 0x8c) + -1;
    }
  }
  if (*(int *)(in_RDI + 0x78) == 1) {
    pcVar3 = *(char **)(in_RDI + 0x80);
    *(char **)(in_RDI + 0x80) = pcVar3 + 1;
    local_44 = (uint)*pcVar3;
    if (local_44 == 0) {
      *(undefined4 *)(in_RDI + 0x78) = 2;
    }
    else {
      pcVar3 = strchr(short_options,local_44);
      if (pcVar3 == (char *)0x0) {
        return 0x3f;
      }
      if (pcVar3[1] == ':') {
        *(undefined8 *)(in_RDI + 0x98) = **(undefined8 **)(in_RDI + 0x90);
        if (*(long *)(in_RDI + 0x98) == 0) {
          lafe_warnc(0,"Option %c requires an argument",(ulong)local_44);
          return 0x3f;
        }
        *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 8;
        *(int *)(in_RDI + 0x8c) = *(int *)(in_RDI + 0x8c) + -1;
      }
    }
  }
  if (*(int *)(in_RDI + 0x78) == 2) {
    if (**(long **)(in_RDI + 0x90) == 0) {
      return -1;
    }
    if (*(char *)**(undefined8 **)(in_RDI + 0x90) != '-') {
      return -1;
    }
    iVar2 = strcmp((char *)**(undefined8 **)(in_RDI + 0x90),"--");
    if (iVar2 == 0) {
      *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 8;
      *(int *)(in_RDI + 0x8c) = *(int *)(in_RDI + 0x8c) + -1;
      return -1;
    }
    puVar1 = *(undefined8 **)(in_RDI + 0x90);
    *(undefined8 **)(in_RDI + 0x90) = puVar1 + 1;
    *(undefined8 *)(in_RDI + 0x80) = *puVar1;
    *(int *)(in_RDI + 0x8c) = *(int *)(in_RDI + 0x8c) + -1;
    if (*(char *)(*(long *)(in_RDI + 0x80) + 1) == '-') {
      *(undefined4 *)(in_RDI + 0x78) = 4;
      *(long *)(in_RDI + 0x80) = *(long *)(in_RDI + 0x80) + 2;
    }
    else {
      *(undefined4 *)(in_RDI + 0x78) = 3;
      *(long *)(in_RDI + 0x80) = *(long *)(in_RDI + 0x80) + 1;
    }
  }
  if (*(int *)(in_RDI + 0x78) == 3) {
    pcVar3 = *(char **)(in_RDI + 0x80);
    *(char **)(in_RDI + 0x80) = pcVar3 + 1;
    local_44 = (uint)*pcVar3;
    if (local_44 == 0) {
      *(undefined4 *)(in_RDI + 0x78) = 2;
      iVar2 = bsdtar_getopt(in_stack_ffffffffffffffe8);
      return iVar2;
    }
    pcVar3 = strchr(short_options,local_44);
    if (pcVar3 == (char *)0x0) {
      return 0x3f;
    }
    if (pcVar3[1] == ':') {
      if (**(char **)(in_RDI + 0x80) == '\0') {
        *(undefined8 *)(in_RDI + 0x80) = **(undefined8 **)(in_RDI + 0x90);
        if (*(long *)(in_RDI + 0x80) == 0) {
          lafe_warnc(0,"Option -%c requires an argument",(ulong)local_44);
          return 0x3f;
        }
        *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 8;
        *(int *)(in_RDI + 0x8c) = *(int *)(in_RDI + 0x8c) + -1;
      }
      if (local_44 == 0x57) {
        *(undefined4 *)(in_RDI + 0x78) = 4;
        local_38 = "-W ";
      }
      else {
        *(undefined4 *)(in_RDI + 0x78) = 2;
        *(undefined8 *)(in_RDI + 0x98) = *(undefined8 *)(in_RDI + 0x80);
      }
    }
  }
  if (*(int *)(in_RDI + 0x78) == 4) {
    *(undefined4 *)(in_RDI + 0x78) = 2;
    pcVar3 = strchr(*(char **)(in_RDI + 0x80),0x3d);
    if (pcVar3 == (char *)0x0) {
      local_40 = strlen(*(char **)(in_RDI + 0x80));
    }
    else {
      local_40 = (long)pcVar3 - *(long *)(in_RDI + 0x80);
      *(char **)(in_RDI + 0x98) = pcVar3 + 1;
    }
    pbVar5 = tar_longopts;
    while (pbVar5->name != (char *)0x0) {
      pbVar6 = pbVar5;
      if ((*pbVar5->name == **(char **)(in_RDI + 0x80)) &&
         (iVar2 = strncmp(*(char **)(in_RDI + 0x80),pbVar5->name,local_40), pbVar6 = pbVar5,
         iVar2 == 0)) {
        local_28 = local_20;
        sVar4 = strlen(pbVar5->name);
        local_20 = pbVar5;
        if (sVar4 == local_40) {
          local_28 = (bsdtar_option *)0x0;
          break;
        }
      }
      pbVar5 = pbVar6 + 1;
    }
    if (local_20 == (bsdtar_option *)0x0) {
      lafe_warnc(0,"Option %s%s is not supported",local_38,*(undefined8 *)(in_RDI + 0x80));
      local_4 = 0x3f;
    }
    else if (local_28 == (bsdtar_option *)0x0) {
      if (local_20->required == 0) {
        if (*(long *)(in_RDI + 0x98) != 0) {
          lafe_warnc(0,"Option %s%s does not allow an argument",local_38,local_20->name);
          return 0x3f;
        }
      }
      else if (*(long *)(in_RDI + 0x98) == 0) {
        *(undefined8 *)(in_RDI + 0x98) = **(undefined8 **)(in_RDI + 0x90);
        if (*(long *)(in_RDI + 0x98) == 0) {
          lafe_warnc(0,"Option %s%s requires an argument",local_38,local_20->name);
          return 0x3f;
        }
        *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 8;
        *(int *)(in_RDI + 0x8c) = *(int *)(in_RDI + 0x8c) + -1;
      }
      local_4 = local_20->equivalent;
    }
    else {
      lafe_warnc(0,"Ambiguous option %s%s (matches --%s and --%s)",local_38,
                 *(undefined8 *)(in_RDI + 0x80),local_20->name,local_28->name);
      local_4 = 0x3f;
    }
  }
  else {
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

int
bsdtar_getopt(struct bsdtar *bsdtar)
{
	enum { state_start = 0, state_old_tar, state_next_word,
	       state_short, state_long };

	const struct bsdtar_option *popt, *match = NULL, *match2 = NULL;
	const char *p, *long_prefix = "--";
	size_t optlength;
	int opt = '?';
	int required = 0;

	bsdtar->argument = NULL;

	/* First time through, initialize everything. */
	if (bsdtar->getopt_state == state_start) {
		/* Skip program name. */
		++bsdtar->argv;
		--bsdtar->argc;
		if (*bsdtar->argv == NULL)
			return (-1);
		/* Decide between "new style" and "old style" arguments. */
		if (bsdtar->argv[0][0] == '-') {
			bsdtar->getopt_state = state_next_word;
		} else {
			bsdtar->getopt_state = state_old_tar;
			bsdtar->getopt_word = *bsdtar->argv++;
			--bsdtar->argc;
		}
	}

	/*
	 * We're parsing old-style tar arguments
	 */
	if (bsdtar->getopt_state == state_old_tar) {
		/* Get the next option character. */
		opt = *bsdtar->getopt_word++;
		if (opt == '\0') {
			/* New-style args can follow old-style. */
			bsdtar->getopt_state = state_next_word;
		} else {
			/* See if it takes an argument. */
			p = strchr(short_options, opt);
			if (p == NULL)
				return ('?');
			if (p[1] == ':') {
				bsdtar->argument = *bsdtar->argv;
				if (bsdtar->argument == NULL) {
					lafe_warnc(0,
					    "Option %c requires an argument",
					    opt);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
		}
	}

	/*
	 * We're ready to look at the next word in argv.
	 */
	if (bsdtar->getopt_state == state_next_word) {
		/* No more arguments, so no more options. */
		if (bsdtar->argv[0] == NULL)
			return (-1);
		/* Doesn't start with '-', so no more options. */
		if (bsdtar->argv[0][0] != '-')
			return (-1);
		/* "--" marks end of options; consume it and return. */
		if (strcmp(bsdtar->argv[0], "--") == 0) {
			++bsdtar->argv;
			--bsdtar->argc;
			return (-1);
		}
		/* Get next word for parsing. */
		bsdtar->getopt_word = *bsdtar->argv++;
		--bsdtar->argc;
		if (bsdtar->getopt_word[1] == '-') {
			/* Set up long option parser. */
			bsdtar->getopt_state = state_long;
			bsdtar->getopt_word += 2; /* Skip leading '--' */
		} else {
			/* Set up short option parser. */
			bsdtar->getopt_state = state_short;
			++bsdtar->getopt_word;  /* Skip leading '-' */
		}
	}

	/*
	 * We're parsing a group of POSIX-style single-character options.
	 */
	if (bsdtar->getopt_state == state_short) {
		/* Peel next option off of a group of short options. */
		opt = *bsdtar->getopt_word++;
		if (opt == '\0') {
			/* End of this group; recurse to get next option. */
			bsdtar->getopt_state = state_next_word;
			return bsdtar_getopt(bsdtar);
		}

		/* Does this option take an argument? */
		p = strchr(short_options, opt);
		if (p == NULL)
			return ('?');
		if (p[1] == ':')
			required = 1;

		/* If it takes an argument, parse that. */
		if (required) {
			/* If arg is run-in, bsdtar->getopt_word already points to it. */
			if (bsdtar->getopt_word[0] == '\0') {
				/* Otherwise, pick up the next word. */
				bsdtar->getopt_word = *bsdtar->argv;
				if (bsdtar->getopt_word == NULL) {
					lafe_warnc(0,
					    "Option -%c requires an argument",
					    opt);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
			if (opt == 'W') {
				bsdtar->getopt_state = state_long;
				long_prefix = "-W "; /* For clearer errors. */
			} else {
				bsdtar->getopt_state = state_next_word;
				bsdtar->argument = bsdtar->getopt_word;
			}
		}
	}

	/* We're reading a long option, including -W long=arg convention. */
	if (bsdtar->getopt_state == state_long) {
		/* After this long option, we'll be starting a new word. */
		bsdtar->getopt_state = state_next_word;

		/* Option name ends at '=' if there is one. */
		p = strchr(bsdtar->getopt_word, '=');
		if (p != NULL) {
			optlength = (size_t)(p - bsdtar->getopt_word);
			bsdtar->argument = (char *)(uintptr_t)(p + 1);
		} else {
			optlength = strlen(bsdtar->getopt_word);
		}

		/* Search the table for an unambiguous match. */
		for (popt = tar_longopts; popt->name != NULL; popt++) {
			/* Short-circuit if first chars don't match. */
			if (popt->name[0] != bsdtar->getopt_word[0])
				continue;
			/* If option is a prefix of name in table, record it.*/
			if (strncmp(bsdtar->getopt_word, popt->name, optlength) == 0) {
				match2 = match; /* Record up to two matches. */
				match = popt;
				/* If it's an exact match, we're done. */
				if (strlen(popt->name) == optlength) {
					match2 = NULL; /* Forget the others. */
					break;
				}
			}
		}

		/* Fail if there wasn't a unique match. */
		if (match == NULL) {
			lafe_warnc(0,
			    "Option %s%s is not supported",
			    long_prefix, bsdtar->getopt_word);
			return ('?');
		}
		if (match2 != NULL) {
			lafe_warnc(0,
			    "Ambiguous option %s%s (matches --%s and --%s)",
			    long_prefix, bsdtar->getopt_word, match->name, match2->name);
			return ('?');
		}

		/* We've found a unique match; does it need an argument? */
		if (match->required) {
			/* Argument required: get next word if necessary. */
			if (bsdtar->argument == NULL) {
				bsdtar->argument = *bsdtar->argv;
				if (bsdtar->argument == NULL) {
					lafe_warnc(0,
					    "Option %s%s requires an argument",
					    long_prefix, match->name);
					return ('?');
				}
				++bsdtar->argv;
				--bsdtar->argc;
			}
		} else {
			/* Argument forbidden: fail if there is one. */
			if (bsdtar->argument != NULL) {
				lafe_warnc(0,
				    "Option %s%s does not allow an argument",
				    long_prefix, match->name);
				return ('?');
			}
		}
		return (match->equivalent);
	}

	return (opt);
}